

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_layout_helper.h
# Opt level: O3

void __thiscall
google::protobuf::compiler::cpp::FieldGroup::FieldGroup
          (FieldGroup *this,float preferred_location,FieldDescriptor *field,uint64_t num_accesses)

{
  uint32_t uVar1;
  pointer ppFVar2;
  FieldDescriptor *__tmp;
  
  (this->fields_).
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->fields_).
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->fields_).
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ppFVar2 = (pointer)operator_new(8);
  (this->fields_).
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_start = ppFVar2;
  (this->fields_).
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = ppFVar2 + 1;
  *ppFVar2 = field;
  (this->fields_).
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = ppFVar2 + 1;
  this->preferred_location_ = preferred_location;
  uVar1 = EstimateAlignmentSize(field);
  this->estimated_memory_size_ = uVar1;
  return;
}

Assistant:

FieldGroup(float preferred_location, const FieldDescriptor* field,
             uint64_t num_accesses = 0)
      : fields_(1, field),
        preferred_location_(preferred_location),
        estimated_memory_size_(
            static_cast<uint32_t>(EstimateAlignmentSize(field))) {
  }